

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Linux::SublimeMergeFlatpakReporter::SublimeMergeFlatpakReporter
          (SublimeMergeFlatpakReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Linux::SUBLIME_MERGE_FLATPAK();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__SublimeMergeFlatpakReporter_00229638;
  SystemLauncher::setForeground((SystemLauncher *)((long)&in_RDI[1].program.field_2 + 8),true);
  return;
}

Assistant:

SublimeMergeFlatpakReporter::SublimeMergeFlatpakReporter()
            : GenericDiffReporter(DiffPrograms::Linux::SUBLIME_MERGE_FLATPAK())
        {
            launcher.setForeground(true);
        }